

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O1

RealType __thiscall
OpenMD::InteractionManager::getSuggestedCutoffRadius(InteractionManager *this,AtomType *atype)

{
  int iVar1;
  long lVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar1 = AtomType::getIdent(atype);
  lVar2 = (long)iVar1;
  lVar3 = *(long *)&(this->interactions_).
                    super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar2].
                    super__Vector_base<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + lVar2 * 0x30;
  p_Var4 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
  if (p_Var4 == (_Rb_tree_node_base *)(lVar3 + 8)) {
    dVar5 = 0.0;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    do {
      dVar5 = (double)(**(code **)(**(long **)(p_Var4 + 1) + 0x28))
                                (*(long **)(p_Var4 + 1),atype,atype);
      if (dVar5 <= (double)CONCAT44(uVar7,uVar6)) {
        dVar5 = (double)CONCAT44(uVar7,uVar6);
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      uVar6 = SUB84(dVar5,0);
      uVar7 = (undefined4)((ulong)dVar5 >> 0x20);
    } while (p_Var4 != (_Rb_tree_node_base *)
                       (*(long *)&(this->interactions_).
                                  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar2].
                                  super__Vector_base<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data + lVar2 * 0x30 + 8));
  }
  return dVar5;
}

Assistant:

RealType InteractionManager::getSuggestedCutoffRadius(AtomType* atype) {
    if (!initialized_) initialize();

    int atid = atype->getIdent();

    set<NonBondedInteractionPtr>::iterator it;
    RealType cutoff = 0.0;

    for (it = interactions_[atid][atid].begin();
         it != interactions_[atid][atid].end(); ++it) {
      cutoff =
          max(cutoff, (*it)->getSuggestedCutoffRadius(make_pair(atype, atype)));
    }
    return cutoff;
  }